

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O1

int testInvalidUpdatableModelNonUpdatableLayers(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  long lVar4;
  Rep *pRVar5;
  bool bVar6;
  ModelDescription *pMVar7;
  Type *pTVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  TypeUnion this;
  Type *this_00;
  InnerProductLayerParams *this_01;
  WeightParams *pWVar11;
  ostream *poVar12;
  Result res;
  Model m1;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Model local_48;
  
  CoreML::Specification::Model::Model(&local_48);
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_48.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_70 + 0x10;
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  pAVar10->datatype_ = 0x20020;
  iVar2 = (pAVar10->shape_).total_size_;
  if ((pAVar10->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar10->shape_).current_size_;
  (pAVar10->shape_).current_size_ = iVar2 + 1;
  ((pAVar10->shape_).rep_)->elements[iVar2] = 1;
  if (local_48.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_48.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_48.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_70._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_70);
  if ((pointer)local_70._0_8_ != pcVar1) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  ((pFVar9->Type_).multiarraytype_)->datatype_ = 0x20020;
  local_48.isupdatable_ = true;
  local_48.specificationversion_ = 4;
  if (local_48._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_48);
    local_48._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_48.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_48.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01);
    (this_00->layer_).innerproduct_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  *(undefined8 *)&pCVar3->_kernelsize_cached_byte_size_ = 1;
  (pCVar3->stride_).current_size_ = 1;
  (pCVar3->stride_).total_size_ = 0;
  lVar4._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar4._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar4 == 0) {
    pWVar11 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar11);
    *(WeightParams **)&pCVar3->kernelsize_ = pWVar11;
  }
  lVar4 = *(long *)&pCVar3->kernelsize_;
  if (*(int *)(lVar4 + 0x10) == *(int *)(lVar4 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar4 + 0x10),*(int *)(lVar4 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar4 + 0x10);
  *(int *)(lVar4 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar4 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  *(undefined1 *)&(pCVar3->stride_).rep_ = 1;
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar11 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar11);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar11;
  }
  pRVar5 = (pCVar3->kernelsize_).rep_;
  iVar2 = *(int *)((long)&pRVar5[1].arena + 4);
  if (*(int *)&pRVar5[1].arena == iVar2) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar5 + 1),iVar2 + 1);
  }
  iVar2 = *(int *)&pRVar5[1].arena;
  *(int *)&pRVar5[1].arena = iVar2 + 1;
  *(undefined4 *)(pRVar5[1].elements[0] + 8 + (long)iVar2 * 4) = 0x3f800000;
  CoreML::Model::validate((Result *)local_70,&local_48);
  bVar6 = CoreML::Result::good((Result *)local_70);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xf0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_,local_58._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_48);
  return (uint)bVar6;
}

Assistant:

int testInvalidUpdatableModelNonUpdatableLayers() {

    /*
     checks that updatable property is true for atleast one layer if a model is updatable.
     */

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    m1.set_isupdatable(true);
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();

    innerProductLayer->add_input("input");
    innerProductLayer->add_output("probs");

    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    innerProductParams->mutable_weights()->add_floatvalue(1.0);

    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);

    Result res = Model::validate(m1);

    ML_ASSERT_BAD(res);
    return 0;
}